

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.hpp
# Opt level: O3

bool __thiscall
diy::
concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
::empty(concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
        *this)

{
  size_t sVar1;
  unique_lock<tthread::fast_mutex> local_20;
  
  local_20._M_device = &this->mutex_;
  local_20._M_owns = false;
  Catch::clara::std::unique_lock<tthread::fast_mutex>::lock(&local_20);
  sVar1 = (this->map_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (local_20._M_device != (fast_mutex *)0x0) {
    LOCK();
    (local_20._M_device)->mLock = 0;
    UNLOCK();
  }
  return sVar1 == 0;
}

Assistant:

bool            empty()                 { lock_guard<fast_mutex> l(mutex_); return map_.empty(); }